

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O3

void benchmark::internal::ParseCommandLineFlags(int *argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  _Head_base<0UL,_benchmark::internal::Benchmark_*,_false> str;
  __uniq_ptr_impl<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>
  _Stack_58;
  char **ppcStack_50;
  string *local_40 [2];
  
  if (1 < *argc) {
    iVar4 = 1;
    do {
      ppcStack_50 = (char **)0x11d8ef;
      bVar2 = ParseBoolFlag(argv[iVar4],"benchmark_list_tests",&FLAGS_benchmark_list_tests);
      if (bVar2) {
LAB_0011d9fa:
        iVar3 = *argc;
        if (iVar3 != iVar4) {
          lVar5 = 0;
          do {
            argv[iVar4 + lVar5] = argv[(long)iVar4 + lVar5 + 1];
            lVar5 = lVar5 + 1;
          } while (iVar3 - iVar4 != (int)lVar5);
        }
        iVar3 = iVar3 + -1;
        *argc = iVar3;
      }
      else {
        ppcStack_50 = (char **)0x11d90e;
        bVar2 = ParseStringFlag(argv[iVar4],"benchmark_filter",&FLAGS_benchmark_filter_abi_cxx11_);
        if (bVar2) goto LAB_0011d9fa;
        ppcStack_50 = (char **)0x11d92d;
        bVar2 = ParseDoubleFlag(argv[iVar4],"benchmark_min_time",&FLAGS_benchmark_min_time);
        if (bVar2) goto LAB_0011d9fa;
        ppcStack_50 = (char **)0x11d94c;
        bVar2 = ParseInt32Flag(argv[iVar4],"benchmark_repetitions",&FLAGS_benchmark_repetitions);
        if (bVar2) goto LAB_0011d9fa;
        ppcStack_50 = (char **)0x11d96b;
        bVar2 = ParseBoolFlag(argv[iVar4],"benchmark_report_aggregates_only",
                              &FLAGS_benchmark_report_aggregates_only);
        if (bVar2) goto LAB_0011d9fa;
        ppcStack_50 = (char **)0x11d98a;
        bVar2 = ParseStringFlag(argv[iVar4],"benchmark_format",&FLAGS_benchmark_format_abi_cxx11_);
        if (bVar2) goto LAB_0011d9fa;
        ppcStack_50 = (char **)0x11d9a5;
        bVar2 = ParseStringFlag(argv[iVar4],"benchmark_out",&FLAGS_benchmark_out_abi_cxx11_);
        if (bVar2) goto LAB_0011d9fa;
        ppcStack_50 = (char **)0x11d9c0;
        bVar2 = ParseStringFlag(argv[iVar4],"benchmark_out_format",
                                &FLAGS_benchmark_out_format_abi_cxx11_);
        if (bVar2) goto LAB_0011d9fa;
        ppcStack_50 = (char **)0x11d9db;
        bVar2 = ParseBoolFlag(argv[iVar4],"color_print",&FLAGS_color_print);
        if (bVar2) goto LAB_0011d9fa;
        ppcStack_50 = (char **)0x11d9f6;
        bVar2 = ParseInt32Flag(argv[iVar4],"v",&FLAGS_v);
        if (bVar2) goto LAB_0011d9fa;
        str._M_head_impl = (Benchmark *)argv[iVar4];
        ppcStack_50 = (char **)0x11da3f;
        bVar2 = IsFlag((char *)str._M_head_impl,"help");
        if (bVar2) {
          ppcStack_50 = (char **)RegisterBenchmarkInternal;
          PrintUsageAndExit();
          ppcStack_50 = argv;
          BenchmarkFamilies::GetInstance();
          _Stack_58._M_t.
          super__Tuple_impl<0UL,_benchmark::internal::Benchmark_*,_std::default_delete<benchmark::internal::Benchmark>_>
          .super__Head_base<0UL,_benchmark::internal::Benchmark_*,_false>._M_head_impl =
               (tuple<benchmark::internal::Benchmark_*,_std::default_delete<benchmark::internal::Benchmark>_>
                )(tuple<benchmark::internal::Benchmark_*,_std::default_delete<benchmark::internal::Benchmark>_>
                  )str._M_head_impl;
          BenchmarkFamilies::AddBenchmark
                    (&BenchmarkFamilies::GetInstance::instance,
                     (unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>
                      *)&_Stack_58);
          if ((_Tuple_impl<0UL,_benchmark::internal::Benchmark_*,_std::default_delete<benchmark::internal::Benchmark>_>
               )_Stack_58._M_t.
                super__Tuple_impl<0UL,_benchmark::internal::Benchmark_*,_std::default_delete<benchmark::internal::Benchmark>_>
                .super__Head_base<0UL,_benchmark::internal::Benchmark_*,_false>._M_head_impl !=
              (Benchmark *)0x0) {
            (**(code **)(*(long *)_Stack_58._M_t.
                                  super__Tuple_impl<0UL,_benchmark::internal::Benchmark_*,_std::default_delete<benchmark::internal::Benchmark>_>
                                  .super__Head_base<0UL,_benchmark::internal::Benchmark_*,_false>.
                                  _M_head_impl + 8))();
          }
          return;
        }
        iVar3 = *argc;
        iVar4 = iVar4 + 1;
      }
    } while (iVar4 < iVar3);
  }
  local_40[0] = &FLAGS_benchmark_format_abi_cxx11_;
  local_40[1] = &FLAGS_benchmark_out_format_abi_cxx11_;
  lVar5 = 0;
  do {
    pcVar1 = *(char **)((long)local_40 + lVar5);
    ppcStack_50 = (char **)0x11da8e;
    iVar4 = std::__cxx11::string::compare(pcVar1);
    if (iVar4 != 0) {
      ppcStack_50 = (char **)0x11da9d;
      iVar4 = std::__cxx11::string::compare(pcVar1);
      if (iVar4 != 0) {
        ppcStack_50 = (char **)0x11daac;
        iVar4 = std::__cxx11::string::compare(pcVar1);
        if (iVar4 != 0) {
          ppcStack_50 = (char **)0x11dae9;
          fwrite("benchmark [--benchmark_list_tests={true|false}]\n          [--benchmark_filter=<regex>]\n          [--benchmark_min_time=<min_time>]\n          [--benchmark_repetitions=<num_repetitions>]\n          [--benchmark_report_aggregates_only={true|false}\n          [--benchmark_format=<console|json|csv>]\n          [--benchmark_out=<filename>]\n          [--benchmark_out_format=<json|console|csv>]\n          [--color_print={true|false}]\n          [--v=<verbosity>]\n"
                 ,0x1c6,1,_stdout);
          ppcStack_50 = (char **)0x11daf0;
          exit(0);
        }
      }
    }
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x10);
  return;
}

Assistant:

void ParseCommandLineFlags(int* argc, char** argv) {
  using namespace benchmark;
  for (int i = 1; i < *argc; ++i) {
    if (
        ParseBoolFlag(argv[i], "benchmark_list_tests",
                      &FLAGS_benchmark_list_tests) ||
        ParseStringFlag(argv[i], "benchmark_filter",
                        &FLAGS_benchmark_filter) ||
        ParseDoubleFlag(argv[i], "benchmark_min_time",
                        &FLAGS_benchmark_min_time) ||
        ParseInt32Flag(argv[i], "benchmark_repetitions",
                       &FLAGS_benchmark_repetitions) ||
        ParseBoolFlag(argv[i], "benchmark_report_aggregates_only",
                       &FLAGS_benchmark_report_aggregates_only) ||
        ParseStringFlag(argv[i], "benchmark_format",
                        &FLAGS_benchmark_format) ||
        ParseStringFlag(argv[i], "benchmark_out",
                        &FLAGS_benchmark_out) ||
        ParseStringFlag(argv[i], "benchmark_out_format",
                        &FLAGS_benchmark_out_format) ||
        ParseBoolFlag(argv[i], "color_print",
                       &FLAGS_color_print) ||
        ParseInt32Flag(argv[i], "v", &FLAGS_v)) {
      for (int j = i; j != *argc; ++j) argv[j] = argv[j + 1];

      --(*argc);
      --i;
    } else if (IsFlag(argv[i], "help")) {
      PrintUsageAndExit();
    }
  }
  for (auto const* flag : {&FLAGS_benchmark_format,
                           &FLAGS_benchmark_out_format})
  if (*flag != "console" && *flag != "json" && *flag != "csv") {
    PrintUsageAndExit();
  }
}